

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testzlib.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  byte bVar1;
  bool bVar2;
  uint __line;
  int iVar3;
  ssh_decompressor *psVar4;
  FILE *__stream;
  size_t sVar5;
  char *__format;
  char *pcVar6;
  bool bVar7;
  int outlen;
  uchar *outbuf;
  uchar buf [16];
  
  bVar2 = true;
  pcVar6 = (char *)0x0;
LAB_001012a3:
  bVar1 = 1;
LAB_001012a5:
  do {
    argc = argc + -1;
    argv = argv + 1;
    if (argc == 0) {
      psVar4 = zlib_decompress_init();
      if ((!bVar2) &&
         ((*psVar4->vt->decompress)(psVar4,main::ersatz_zlib_header,2,&outbuf,&outlen), outlen != 0)
         ) {
        pcVar6 = "outlen == 0";
        __line = 0x4e;
LAB_001014f8:
        __assert_fail(pcVar6,
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testzlib.c"
                      ,__line,"int main(int, char **)");
      }
      if (pcVar6 == (char *)0x0) {
        __stream = _stdin;
        if (_stdin == (FILE *)0x0) {
          pcVar6 = "filename";
          __line = 0x57;
          goto LAB_001014f8;
        }
      }
      else {
        __stream = fopen(pcVar6,"rb");
        if (__stream == (FILE *)0x0) {
          __format = "unable to open \'%s\'\n";
          goto LAB_00101370;
        }
      }
      while( true ) {
        sVar5 = fread(buf,1,0x10,__stream);
        if ((int)sVar5 < 1) {
          (*psVar4->vt->decompress_free)(psVar4);
          if (pcVar6 != (char *)0x0) {
            fclose(__stream);
          }
          return 0;
        }
        (*psVar4->vt->decompress)(psVar4,buf,(int)sVar5,&outbuf,&outlen);
        if (outbuf == (uchar *)0x0) break;
        if ((long)outlen != 0) {
          fwrite(outbuf,1,(long)outlen,_stdout);
        }
        safefree(outbuf);
      }
      fwrite("decoding error\n",0xf,1,_stderr);
      fclose(__stream);
      return 1;
    }
    __s1 = *argv;
    if (!(bool)(*__s1 != '-' | ~bVar1 & 1)) break;
    bVar7 = pcVar6 != (char *)0x0;
    pcVar6 = __s1;
    if (bVar7) {
      fwrite("can only handle one filename\n",0x1d,1,_stderr);
      return 1;
    }
  } while( true );
  if ((__s1[1] == 'd') && (__s1[2] == '\0')) goto LAB_001012ff;
  if ((__s1[1] != '-') || (bVar1 = 0, __s1[2] != '\0')) {
    iVar3 = strcmp(__s1,"--help");
    if (iVar3 == 0) {
      puts("usage: testzlib          decode zlib (RFC1950) data from standard input");
      puts("       testzlib -d       decode Deflate (RFC1951) data from standard input");
      puts("       testzlib --help   display this text");
      return 0;
    }
    __format = "unknown command line option \'%s\'\n";
    pcVar6 = __s1;
LAB_00101370:
    fprintf(_stderr,__format,pcVar6);
    return 1;
  }
  goto LAB_001012a5;
LAB_001012ff:
  bVar2 = false;
  goto LAB_001012a3;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned char buf[16], *outbuf;
    int ret, outlen;
    ssh_decompressor *handle;
    int noheader = false, opts = true;
    char *filename = NULL;
    FILE *fp;

    while (--argc) {
        char *p = *++argv;

        if (p[0] == '-' && opts) {
            if (!strcmp(p, "-d")) {
                noheader = true;
            } else if (!strcmp(p, "--")) {
                opts = false;          /* next thing is filename */
            } else if (!strcmp(p, "--help")) {
                printf("usage: testzlib          decode zlib (RFC1950) data"
                       " from standard input\n");
                printf("       testzlib -d       decode Deflate (RFC1951) data"
                       " from standard input\n");
                printf("       testzlib --help   display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else if (!filename) {
            filename = p;
        } else {
            fprintf(stderr, "can only handle one filename\n");
            return 1;
        }
    }

    handle = ssh_decompressor_new(&ssh_zlib);

    if (noheader) {
        /*
         * Provide missing zlib header if -d was specified.
         */
        static const unsigned char ersatz_zlib_header[] = { 0x78, 0x9C };
        ssh_decompressor_decompress(
            handle, ersatz_zlib_header, sizeof(ersatz_zlib_header),
            &outbuf, &outlen);
        assert(outlen == 0);
    }

    if (filename)
        fp = fopen(filename, "rb");
    else
        fp = stdin;

    if (!fp) {
        assert(filename);
        fprintf(stderr, "unable to open '%s'\n", filename);
        return 1;
    }

    while (1) {
        ret = fread(buf, 1, sizeof(buf), fp);
        if (ret <= 0)
            break;
        ssh_decompressor_decompress(handle, buf, ret, &outbuf, &outlen);
        if (outbuf) {
            if (outlen)
                fwrite(outbuf, 1, outlen, stdout);
            sfree(outbuf);
        } else {
            fprintf(stderr, "decoding error\n");
            fclose(fp);
            return 1;
        }
    }

    ssh_decompressor_free(handle);

    if (filename)
        fclose(fp);

    return 0;
}